

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O0

pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
* __thiscall
QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
::try_emplace<QDBusListener::ChangeSignal>
          (QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
           *this,DBusKey *key,ChangeSignal *args)

{
  iterator it_00;
  iterator it_01;
  bool bVar1;
  iterator o;
  iterator o_00;
  containers *in_RDX;
  const_iterator in_RSI;
  DBusKey *in_RDI;
  long in_FS_OFFSET;
  iterator it;
  DBusKey *in_stack_ffffffffffffff28;
  parameter_type t;
  containers *in_stack_ffffffffffffff30;
  DBusKey *this_00;
  bool local_a9;
  const_iterator in_stack_ffffffffffffff58;
  bool local_6a;
  bool local_69;
  containers *local_68;
  size_type local_60;
  const_iterator local_58;
  iterator local_50;
  containers *local_40;
  size_type local_38;
  const_iterator local_30;
  iterator local_28;
  iterator local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.i = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  local_18.c = (containers *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  local_18 = lower_bound((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                          *)in_RSI.i,in_RDI);
  local_28 = end((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                  *)in_RDI);
  bVar1 = iterator::operator==(&local_18,&local_28);
  local_a9 = true;
  if (!bVar1) {
    iterator::key((iterator *)0xb269ea);
    local_a9 = std::less<QDBusListener::DBusKey>::operator()
                         ((less<QDBusListener::DBusKey> *)in_RDX,in_stack_ffffffffffffff28,
                          (DBusKey *)0xb269fc);
    in_stack_ffffffffffffff30 = in_RDX;
  }
  if (local_a9 == false) {
    local_6a = false;
    std::
    pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
    ::
    pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator_&,_bool,_true>
              ((pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
                *)in_RDI,&local_18,&local_6a);
  }
  else {
    t = (parameter_type)&(in_RSI.i)->key;
    local_40 = local_18.c;
    local_38 = local_18.i;
    it_00.i = (size_type)in_RDI;
    it_00.c = in_stack_ffffffffffffff30;
    o = toValuesIterator((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                          *)t,it_00);
    QList<QDBusListener::ChangeSignal>::const_iterator::const_iterator(&local_30,o);
    QList<QDBusListener::ChangeSignal>::emplace<QDBusListener::ChangeSignal>
              ((QList<QDBusListener::ChangeSignal> *)this_00,in_stack_ffffffffffffff58,
               (ChangeSignal *)in_RDI);
    local_68 = local_18.c;
    local_60 = local_18.i;
    it_01.i = (size_type)in_RDI;
    it_01.c = in_stack_ffffffffffffff30;
    o_00 = toKeysIterator((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                           *)t,it_01);
    QList<QDBusListener::DBusKey>::const_iterator::const_iterator(&local_58,o_00);
    QList<QDBusListener::DBusKey>::insert(&in_stack_ffffffffffffff30->keys,in_RSI,t);
    local_50 = fromKeysIterator((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                                 *)in_RSI.i,o_00);
    local_69 = true;
    std::
    pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
    ::
    pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool,_true>
              ((pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
                *)in_RDI,&local_50,&local_69);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
            *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<iterator, bool> try_emplace(const Key &key, Args&&...args)
    {
        auto it = lower_bound(key);
        if (it == end() || key_compare::operator()(key, it.key())) {
            c.values.emplace(toValuesIterator(it), std::forward<Args>(args)...);
            return { fromKeysIterator(c.keys.insert(toKeysIterator(it), key)), true };
        } else {
            return {it, false};
        }
    }